

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O2

Utest * __thiscall
TEST_ScoringTableTest_DealerSelfDrawn_TestShell::createTest
          (TEST_ScoringTableTest_DealerSelfDrawn_TestShell *this)

{
  TEST_ScoringTableTest_DealerSelfDrawn_Test *this_00;
  
  this_00 = (TEST_ScoringTableTest_DealerSelfDrawn_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                         ,0x25);
  TEST_ScoringTableTest_DealerSelfDrawn_Test::TEST_ScoringTableTest_DealerSelfDrawn_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(ScoringTableTest, DealerSelfDrawn)
{
	CHECK_EQUAL(500, t.dealerSelfDrawn(1, 30));
	CHECK_EQUAL(700, t.dealerSelfDrawn(1, 40));
	CHECK_EQUAL(800, t.dealerSelfDrawn(1, 50));
	CHECK_EQUAL(1000, t.dealerSelfDrawn(1, 60));
	CHECK_EQUAL(1200, t.dealerSelfDrawn(1, 70));

	CHECK_EQUAL(700, t.dealerSelfDrawn(2, 20));
	CHECK_EQUAL(1000, t.dealerSelfDrawn(2, 30));
	CHECK_EQUAL(1300, t.dealerSelfDrawn(2, 40));
	CHECK_EQUAL(1600, t.dealerSelfDrawn(2, 50));
	CHECK_EQUAL(2000, t.dealerSelfDrawn(2, 60));
	CHECK_EQUAL(2300, t.dealerSelfDrawn(2, 70));

	CHECK_EQUAL(1300, t.dealerSelfDrawn(3, 20));
	CHECK_EQUAL(2000, t.dealerSelfDrawn(3, 30));
	CHECK_EQUAL(2600, t.dealerSelfDrawn(3, 40));
	CHECK_EQUAL(3200, t.dealerSelfDrawn(3, 50));
	CHECK_EQUAL(3900, t.dealerSelfDrawn(3, 60));

	CHECK_EQUAL(2600, t.dealerSelfDrawn(4, 20));
	CHECK_EQUAL(3900, t.dealerSelfDrawn(4, 30));
}